

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::initialize<std::__cxx11::string>
          (optional<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer pcVar1;
  
  if (*this != (optional<std::__cxx11::string>)0x1) {
    *(optional<std::__cxx11::string> **)(this + 8) = this + 0x18;
    pcVar1 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(this + 8),pcVar1,pcVar1 + value->_M_string_length);
    *this = (optional<std::__cxx11::string>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5d4,
                "void nonstd::optional_lite::optional<std::basic_string<char>>::initialize(const V &) [T = std::basic_string<char>, V = std::basic_string<char>]"
               );
}

Assistant:

void initialize( V const & value )
    {
        assert( ! has_value()  );
        contained.construct_value( value );
        has_value_ = true;
    }